

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * parse_function_body(dmr_C *C,token *token,symbol *decl,symbol_list **list)

{
  parse_state_t *ppVar1;
  symbol *psVar2;
  unsigned_long uVar3;
  context_list *pcVar4;
  uint uVar5;
  undefined4 uVar6;
  char *pcVar7;
  ulong uVar8;
  statement *psVar9;
  symbol *sym;
  symbol *psVar10;
  token *ptVar11;
  void *pvVar12;
  ulong uVar13;
  undefined1 local_70 [8];
  ptr_list_iter argiter__;
  
  psVar10 = (decl->field_14).field_2.ctype.base_type;
  ppVar1 = C->P;
  argiter__._16_8_ = ppVar1->function_symbol_list;
  uVar13 = (ulong)(*(uint *)((long)&decl->field_14 + 0x18) >> 0xe & 0x10);
  ppVar1->function_symbol_list = (symbol_list **)((long)&decl->field_14 + uVar13 + 0x50);
  ppVar1->function_computed_target_list = (symbol_list *)0x0;
  ppVar1->function_computed_goto_list = (statement_list *)0x0;
  uVar8 = (decl->field_14).field_2.ctype.modifiers;
  if (((uint)uVar8 & 0x40008) == 8) {
    pcVar7 = dmrC_show_ident(C,decl->ident);
    dmrC_warning(C,decl->pos,"function \'%s\' with external linkage has definition",pcVar7);
    uVar8 = (decl->field_14).field_2.ctype.modifiers;
  }
  if ((uVar8 & 4) == 0) {
    (decl->field_14).field_2.ctype.modifiers = uVar8 | 8;
  }
  psVar9 = dmrC_alloc_statement(C,decl->pos,3);
  dmrC_start_function_scope(C);
  sym = dmrC_alloc_symbol(C->S,decl->pos,3);
  psVar2 = (decl->field_14).field_2.ctype.base_type;
  uVar3 = (psVar2->field_14).field_2.ctype.alignment;
  pcVar4 = (psVar2->field_14).field_2.ctype.contexts;
  uVar5 = *(uint *)((long)&psVar2->field_14 + 0x30);
  uVar6 = *(undefined4 *)((long)&psVar2->field_14 + 0x34);
  (sym->field_14).field_2.ctype.modifiers = (psVar2->field_14).field_2.ctype.modifiers;
  (sym->field_14).field_2.ctype.alignment = uVar3;
  (sym->field_14).field_2.ctype.contexts = pcVar4;
  *(uint *)((long)&sym->field_14 + 0x30) = uVar5;
  *(undefined4 *)((long)&sym->field_14 + 0x34) = uVar6;
  (sym->field_14).field_2.ctype.base_type = (psVar2->field_14).field_2.ctype.base_type;
  (sym->field_14).field_2.ctype.modifiers =
       (sym->field_14).field_2.ctype.modifiers & 0xffffffffff01ffc0 | 3;
  dmrC_bind_symbol(C->S,sym,C->S->return_ident,NS_ITERATOR);
  (psVar9->field_2).field_2.ret_target = sym;
  fn_local_symbol(C,sym);
  C->current_fn = decl;
  *(statement **)((long)&psVar10->field_14 + uVar13 + 0x48) = psVar9;
  ptrlist_forward_iterator
            ((ptr_list_iter *)local_70,(ptr_list *)(psVar10->field_14).field_2.arguments);
  while( true ) {
    psVar10 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_70);
    if (psVar10 == (symbol *)0x0) break;
    if (psVar10->ident == (ident *)0x0) {
      dmrC_sparse_error(C,psVar10->pos,"no identifier for function argument");
    }
    else {
      dmrC_bind_symbol(C->S,psVar10,psVar10->ident,NS_SYMBOL);
    }
  }
  ptVar11 = statement_list(C,token->next,(statement_list **)&(psVar9->field_2).field_0);
  C->current_fn = (symbol *)0x0;
  dmrC_end_function_scope(C);
  if ((*(byte *)((long)&decl->field_14 + 0x1a) & 4) == 0) {
    ptrlist_add((ptr_list **)list,decl,&C->ptrlist_allocator);
  }
  dmrC_check_declaration(C->S,decl);
  (decl->field_14).field_2.definition = decl;
  psVar10 = (decl->field_12).same_symbol;
  if ((psVar10 == (symbol *)0x0) || ((psVar10->field_14).field_2.definition == (symbol *)0x0)) {
    for (; psVar10 != (symbol *)0x0; psVar10 = (psVar10->field_12).same_symbol) {
      dmrC_rebind_scope(C,psVar10,decl->scope);
      (psVar10->field_14).field_2.definition = decl;
    }
  }
  else {
    pcVar7 = dmrC_show_ident(C,decl->ident);
    dmrC_warning(C,decl->pos,"multiple definitions for function \'%s\'",pcVar7);
    dmrC_info(C,((psVar10->field_14).field_2.definition)->pos," the previous one is here");
  }
  ppVar1 = C->P;
  ppVar1->function_symbol_list = (symbol_list **)argiter__._16_8_;
  if (ppVar1->function_computed_goto_list != (statement_list *)0x0) {
    if (ppVar1->function_computed_target_list == (symbol_list *)0x0) {
      pcVar7 = dmrC_show_ident(C,decl->ident);
      dmrC_warning(C,decl->pos,"function \'%s\' has computed goto but no targets?",pcVar7);
    }
    else {
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_70,(ptr_list *)ppVar1->function_computed_goto_list);
      while( true ) {
        pvVar12 = ptrlist_iter_next((ptr_list_iter *)local_70);
        if (pvVar12 == (void *)0x0) break;
        *(symbol_list **)((long)pvVar12 + 0x20) = C->P->function_computed_target_list;
      }
    }
  }
  ptVar11 = dmrC_expect_token(C,ptVar11,0x7d,"at end of function");
  return ptVar11;
}

Assistant:

static struct token *parse_function_body(struct dmr_C *C, struct token *token, struct symbol *decl,
	struct symbol_list **list)
{
	struct symbol_list **old_symbol_list;
	struct symbol *base_type = decl->ctype.base_type;
	struct statement *stmt, **p;
	struct symbol *prev;
	struct symbol *arg;

	old_symbol_list = C->P->function_symbol_list;
	if (decl->ctype.modifiers & MOD_INLINE) {
		C->P->function_symbol_list = &decl->inline_symbol_list;
		p = &base_type->inline_stmt;
	} else {
		C->P->function_symbol_list = &decl->symbol_list;
		p = &base_type->stmt;
	}
	C->P->function_computed_target_list = NULL;
	C->P->function_computed_goto_list = NULL;

	if (decl->ctype.modifiers & MOD_EXTERN) {
		if (!(decl->ctype.modifiers & MOD_INLINE))
			dmrC_warning(C, decl->pos, "function '%s' with external linkage has definition", dmrC_show_ident(C, decl->ident));
	}
	if (!(decl->ctype.modifiers & MOD_STATIC))
		decl->ctype.modifiers |= MOD_EXTERN;

	stmt = start_function(C, decl);

	*p = stmt;
	FOR_EACH_PTR (base_type->arguments, arg) {
		declare_argument(C, arg, base_type);
	} END_FOR_EACH_PTR(arg);

	token = dmrC_compound_statement(C, token->next, stmt);

	end_function(C, decl);
	if (!(decl->ctype.modifiers & MOD_INLINE))
		dmrC_add_symbol(C, list, decl);
	dmrC_check_declaration(C->S, decl);
	decl->definition = decl;
	prev = decl->same_symbol;
	if (prev && prev->definition) {
		dmrC_warning(C, decl->pos, "multiple definitions for function '%s'",
			dmrC_show_ident(C, decl->ident));
		dmrC_info(C, prev->definition->pos, " the previous one is here");
	} else {
		while (prev) {
			dmrC_rebind_scope(C, prev, decl->scope);
			prev->definition = decl;
			prev = prev->same_symbol;
		}
	}
	C->P->function_symbol_list = old_symbol_list;
	if (C->P->function_computed_goto_list) {
		if (!C->P->function_computed_target_list)
			dmrC_warning(C, decl->pos, "function '%s' has computed goto but no targets?", dmrC_show_ident(C, decl->ident));
		else {
			FOR_EACH_PTR(C->P->function_computed_goto_list, stmt) {
				stmt->target_list = C->P->function_computed_target_list;
			} END_FOR_EACH_PTR(stmt);
		}
	}
	return dmrC_expect_token(C, token, '}', "at end of function");
}